

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcObj.c
# Opt level: O0

void Abc_NtkDeleteAll_rec(Abc_Obj_t *pObj)

{
  int iVar1;
  Vec_Ptr_t *vNodes_00;
  Abc_Obj_t *pObj_00;
  int local_1c;
  int i;
  Vec_Ptr_t *vNodes;
  Abc_Obj_t *pObj_local;
  
  iVar1 = Abc_ObjIsComplement(pObj);
  if (iVar1 != 0) {
    __assert_fail("!Abc_ObjIsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcObj.c"
                  ,0x13f,"void Abc_NtkDeleteAll_rec(Abc_Obj_t *)");
  }
  iVar1 = Abc_ObjFanoutNum(pObj);
  if (iVar1 != 0) {
    __assert_fail("Abc_ObjFanoutNum(pObj) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcObj.c"
                  ,0x140,"void Abc_NtkDeleteAll_rec(Abc_Obj_t *)");
  }
  vNodes_00 = Vec_PtrAlloc(100);
  Abc_NodeCollectFanins(pObj,vNodes_00);
  Abc_NtkDeleteObj(pObj);
  for (local_1c = 0; iVar1 = Vec_PtrSize(vNodes_00), local_1c < iVar1; local_1c = local_1c + 1) {
    pObj_00 = (Abc_Obj_t *)Vec_PtrEntry(vNodes_00,local_1c);
    iVar1 = Abc_ObjIsNode(pObj_00);
    if ((iVar1 == 0) && (iVar1 = Abc_ObjFanoutNum(pObj_00), iVar1 == 0)) {
      Abc_NtkDeleteAll_rec(pObj_00);
    }
  }
  Vec_PtrFree(vNodes_00);
  return;
}

Assistant:

void Abc_NtkDeleteAll_rec( Abc_Obj_t * pObj )
{
    Vec_Ptr_t * vNodes;
    int i;
    assert( !Abc_ObjIsComplement(pObj) );
    assert( Abc_ObjFanoutNum(pObj) == 0 );
    // delete fanins and fanouts
    vNodes = Vec_PtrAlloc( 100 );
    Abc_NodeCollectFanins( pObj, vNodes );
    Abc_NtkDeleteObj( pObj );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
        if ( !Abc_ObjIsNode(pObj) && Abc_ObjFanoutNum(pObj) == 0 )
            Abc_NtkDeleteAll_rec( pObj );
    Vec_PtrFree( vNodes );
}